

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-lattices.cpp
# Opt level: O0

void __thiscall
wasm::Fuzzer::run(Fuzzer *this,uint64_t seed,uint64_t *latticeElementSeed,string *funcName)

{
  undefined1 *wasm;
  ostream *poVar1;
  __node_base_ptr p_Var2;
  result_type rVar3;
  char *pcVar4;
  Function *func;
  Name NVar5;
  anon_class_16_2_f436c85a visitor;
  Name local_1190;
  undefined1 local_1180 [8];
  TranslateToFuzzReader reader;
  Module testModule;
  size_t i;
  allocator_type local_a09;
  undefined1 local_a08 [8];
  vector<char,_std::allocator<char>_> bytes;
  RandEngine getRand;
  string *funcName_local;
  uint64_t *latticeElementSeed_local;
  uint64_t seed_local;
  Fuzzer *this_local;
  
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
              *)&bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,seed);
  poVar1 = std::operator<<((ostream *)&std::cout,"Running with seed ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,seed);
  std::operator<<(poVar1,"\n");
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_a08,0x1000,&local_a09);
  std::allocator<char>::~allocator(&local_a09);
  testModule.tagsMap._M_h._M_single_bucket = (__node_base_ptr)0x0;
  while( true ) {
    p_Var2 = (__node_base_ptr)
             std::vector<char,_std::allocator<char>_>::size
                       ((vector<char,_std::allocator<char>_> *)local_a08);
    if (p_Var2 <= testModule.tagsMap._M_h._M_single_bucket) break;
    rVar3 = std::
            mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
            ::operator()((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                          *)&bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             field_0x10);
    pcVar4 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)local_a08);
    *(result_type *)(pcVar4 + (long)testModule.tagsMap._M_h._M_single_bucket) = rVar3;
    testModule.tagsMap._M_h._M_single_bucket = testModule.tagsMap._M_h._M_single_bucket + 1;
  }
  Module::Module((Module *)&reader.nesting);
  TranslateToFuzzReader::TranslateToFuzzReader
            ((TranslateToFuzzReader *)local_1180,(Module *)&reader.nesting,
             (vector<char,_std::allocator<char>_> *)local_a08,false);
  TranslateToFuzzReader::build((TranslateToFuzzReader *)local_1180);
  if ((this->verbose & 1U) != 0) {
    std::operator<<((ostream *)&std::cout,"Generated test module: \n");
    std::operator<<((ostream *)&std::cout,(Module *)&reader.nesting);
    std::operator<<((ostream *)&std::cout,"\n");
  }
  if ((latticeElementSeed == (uint64_t *)0x0) || (funcName == (string *)0x0)) {
    wasm = &bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10;
    visitor.this = (Fuzzer *)wasm;
    visitor.getRand = (RandEngine *)this;
    ModuleUtils::
    iterDefinedFunctions<wasm::Fuzzer::run(unsigned_long,unsigned_long*,std::__cxx11::string*)::_lambda(wasm::Function*)_1_>
              ((ModuleUtils *)&reader.nesting,(Module *)wasm,visitor);
  }
  else {
    Name::Name(&local_1190,funcName);
    NVar5.super_IString.str._M_str = (char *)local_1190.super_IString.str._M_len;
    NVar5.super_IString.str._M_len = (size_t)&reader.nesting;
    func = (Function *)::wasm::Module::getFunction(NVar5);
    runOnFunction(this,func,*latticeElementSeed);
  }
  TranslateToFuzzReader::~TranslateToFuzzReader((TranslateToFuzzReader *)local_1180);
  Module::~Module((Module *)&reader.nesting);
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)local_a08);
  return;
}

Assistant:

void run(uint64_t seed,
           uint64_t* latticeElementSeed = nullptr,
           std::string* funcName = nullptr) {
    RandEngine getRand(seed);
    std::cout << "Running with seed " << seed << "\n";

    // 4kb of random bytes should be enough for anyone!
    std::vector<char> bytes(4096);
    for (size_t i = 0; i < bytes.size(); i += sizeof(uint64_t)) {
      *(uint64_t*)(bytes.data() + i) = getRand();
    }

    Module testModule;
    TranslateToFuzzReader reader(testModule, std::move(bytes));
    reader.build();

    if (verbose) {
      std::cout << "Generated test module: \n";
      std::cout << testModule;
      std::cout << "\n";
    }

    // If a specific function and lattice element seed is specified, only run
    // that.
    if (latticeElementSeed && funcName) {
      runOnFunction(testModule.getFunction(*funcName), *latticeElementSeed);
      return;
    }

    ModuleUtils::iterDefinedFunctions(testModule, [&](Function* func) {
      uint64_t funcSeed = getRand();
      runOnFunction(func, funcSeed);
    });
  }